

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::format_assoc<ELFIO::machine_table_t[256],unsigned_short>
          (string *__return_storage_ptr__,dump *this,machine_table_t (*table) [256],
          unsigned_short *key)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  unsigned_short *key_local;
  machine_table_t (*table_local) [256];
  string *str;
  
  find_value_in_table<ELFIO::machine_table_t[256],unsigned_short>
            (__return_storage_ptr__,this,table,key);
  bVar1 = std::operator==(__return_storage_ptr__,"?");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,(string *)__return_storage_ptr__);
    poVar2 = std::operator<<(poVar2," (0x");
    this_00 = (void *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,(*table)[0].key);
    std::operator<<(poVar2,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_assoc( const T& table, const K& key )
    {
        std::string str = find_value_in_table( table, key );
        if ( str == "?" ) {
            std::ostringstream oss;
            oss << str << " (0x" << std::hex << key << ")";
            str = oss.str();
        }

        return str;
    }